

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTestTest.cpp
# Opt level: O2

void __thiscall ContainTestTest::ContainTestTest(ContainTestTest *this)

{
  _Head_base<0UL,_const_oout::Test_*,_false> _Var1;
  unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_> uStack_78;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_70;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_68;
  unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_> local_60;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  char local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  shared_ptr<const_oout::NamedTest> local_28;
  _Head_base<0UL,_const_oout::Test_*,_false> local_18;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ContainTestTest_001cb7e8;
  std::make_unique<oout::ContainTest,char_const(&)[16],char_const(&)[6],char_const(&)[4]>
            ((char (*) [16])&local_60,(char (*) [6])"quick brown fox",(char (*) [4])"quick");
  std::
  make_unique<TestText,std::unique_ptr<oout::ContainTest,std::default_delete<oout::ContainTest>>>
            ((unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_> *)&local_68);
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_38,(char (*) [8])&local_68);
  std::make_shared<oout::NamedTest_const,char_const(&)[12],std::shared_ptr<oout::EqualTest>>
            ((char (*) [12])&local_28,(shared_ptr<oout::EqualTest> *)"Contain all");
  std::make_unique<oout::ContainTest,char_const(&)[24],char_const(&)[4],char_const(&)[4]>
            ((char (*) [24])&uStack_78,(char (*) [4])"jumps over the lazy dog",
             (char (*) [4])0x1a5ea2);
  std::
  make_unique<TestText,std::unique_ptr<oout::ContainTest,std::default_delete<oout::ContainTest>>>
            ((unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_> *)&local_70);
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_58,(char (*) [8])&local_70);
  std::make_shared<oout::NamedTest_const,char_const(&)[19],std::shared_ptr<oout::EqualTest>>
            ((char (*) [19])local_48,(shared_ptr<oout::EqualTest> *)"Not contain one of");
  std::
  make_unique<oout::NamedTest,char_const(&)[16],std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            ((char (*) [16])&local_18,(shared_ptr<const_oout::NamedTest> *)"ContainTestTest",
             &local_28);
  _Var1._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (Test *)0x0;
  (this->tests)._M_t.super___uniq_ptr_impl<const_oout::Test,_std::default_delete<const_oout::Test>_>
  ._M_t.super__Tuple_impl<0UL,_const_oout::Test_*,_std::default_delete<const_oout::Test>_>.
  super__Head_base<0UL,_const_oout::Test_*,_false>._M_head_impl = _Var1._M_head_impl;
  std::unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_>::~unique_ptr
            ((unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_> *)&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr(&local_70);
  std::unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_>::~unique_ptr
            (&uStack_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr(&local_68);
  std::unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_>::~unique_ptr
            (&local_60);
  return;
}

Assistant:

ContainTestTest::ContainTestTest()
	: tests(
		make_unique<NamedTest>(
			"ContainTestTest",
			make_shared<const NamedTest>(
				"Contain all",
				make_shared<EqualTest>(
					make_unique<TestText>(
						make_unique<ContainTest>(
							"quick brown fox",
							"quick",
							"fox"
						)
					),
					"success"
				)
			),
			make_shared<const NamedTest>(
				"Not contain one of",
				make_shared<EqualTest>(
					make_unique<TestText>(
						make_unique<ContainTest>(
							"jumps over the lazy dog",
							"dog",
							"fox"
						)
					),
					"failure"
				)
			)
		)
	)
{
}